

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O3

int __thiscall
vkt::clipping::anon_unknown_0::countPixels
          (anon_unknown_0 *this,ConstPixelBufferAccess *pixels,IVec2 *regionOffset,IVec2 *regionSize
          ,Vec4 *color,Vec4 *colorThreshold)

{
  ChannelType CVar1;
  ChannelOrder y;
  ChannelOrder CVar2;
  ChannelType z;
  int iVar3;
  undefined1 local_c8 [36];
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  z = (pixels->m_format).type;
  CVar1 = (int)regionSize + z;
  iVar3 = 0;
  if ((int)z < (int)CVar1) {
    CVar2 = (int)regionOffset + (pixels->m_format).order;
    local_58 = color->m_data[0] + colorThreshold->m_data[0];
    local_78 = color->m_data[1] + colorThreshold->m_data[1];
    local_98 = color->m_data[2] + colorThreshold->m_data[2];
    local_c8._16_4_ = color->m_data[3] + colorThreshold->m_data[3];
    local_48 = color->m_data[0] - colorThreshold->m_data[0];
    local_68 = color->m_data[1] - colorThreshold->m_data[1];
    local_88 = color->m_data[2] - colorThreshold->m_data[2];
    local_c8._32_4_ = color->m_data[3] - colorThreshold->m_data[3];
    iVar3 = 0;
    local_c8._20_4_ = local_c8._16_4_;
    local_c8._24_4_ = local_c8._16_4_;
    local_c8._28_4_ = local_c8._16_4_;
    fStack_a4 = (float)local_c8._32_4_;
    fStack_a0 = (float)local_c8._32_4_;
    fStack_9c = (float)local_c8._32_4_;
    fStack_94 = (float)local_c8._16_4_;
    fStack_90 = local_98;
    fStack_8c = (float)local_c8._16_4_;
    fStack_84 = (float)local_c8._32_4_;
    fStack_80 = local_88;
    fStack_7c = (float)local_c8._32_4_;
    fStack_74 = local_78;
    fStack_70 = local_78;
    fStack_6c = local_78;
    fStack_64 = local_68;
    fStack_60 = local_68;
    fStack_5c = local_68;
    fStack_54 = local_78;
    fStack_50 = local_98;
    fStack_4c = (float)local_c8._16_4_;
    fStack_44 = local_68;
    fStack_40 = local_88;
    fStack_3c = (float)local_c8._32_4_;
    do {
      y = (pixels->m_format).order;
      if ((int)y < (int)CVar2) {
        do {
          tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_c8,(int)this,y,z);
          if ((((local_48 <= (float)local_c8._0_4_) && ((float)local_c8._0_4_ <= local_58)) &&
              (local_68 <= (float)local_c8._4_4_)) &&
             ((((float)local_c8._4_4_ <= local_78 && (local_88 <= (float)local_c8._8_4_)) &&
              (((float)local_c8._8_4_ <= local_98 &&
               ((float)local_c8._32_4_ <= (float)local_c8._12_4_)))))) {
            iVar3 = (iVar3 + 1) - (uint)((float)local_c8._16_4_ < (float)local_c8._12_4_);
          }
          y = y + A;
        } while (CVar2 != y);
      }
      z = z + SNORM_INT16;
    } while (z != CVar1);
  }
  return iVar3;
}

Assistant:

int countPixels (const tcu::ConstPixelBufferAccess pixels, const IVec2& regionOffset, const IVec2& regionSize, const Vec4& color, const Vec4& colorThreshold)
{
	const Vec4	minColor	= color - colorThreshold;
	const Vec4	maxColor	= color + colorThreshold;
	const int	xEnd		= regionOffset.x() + regionSize.x();
	const int	yEnd		= regionOffset.y() + regionSize.y();
	int			numPixels	= 0;

	DE_ASSERT(xEnd <= pixels.getWidth());
	DE_ASSERT(yEnd <= pixels.getHeight());

	for (int y = regionOffset.y(); y < yEnd; ++y)
	for (int x = regionOffset.x(); x < xEnd; ++x)
	{
		if (isColorInRange(pixels.getPixel(x, y), minColor, maxColor))
			++numPixels;
	}

	return numPixels;
}